

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void free_dfg_state(EVdfg_configuration state)

{
  EVdfg_stone_state __ptr;
  int i;
  long lVar1;
  int j;
  long lVar2;
  
  for (lVar1 = 0; lVar1 < state->stone_count; lVar1 = lVar1 + 1) {
    free(state->stones[lVar1]->out_links);
    free(state->stones[lVar1]->in_links);
    free(state->stones[lVar1]->action);
    __ptr = state->stones[lVar1];
    if (__ptr->extra_actions != (char **)0x0) {
      for (lVar2 = 0; lVar2 < (long)__ptr->action_count + -1; lVar2 = lVar2 + 1) {
        free(__ptr->extra_actions[lVar2]);
        __ptr = state->stones[lVar1];
      }
      free(__ptr->extra_actions);
      __ptr = state->stones[lVar1];
    }
    if (__ptr->attrs != (attr_list)0x0) {
      free_attr_list(__ptr->attrs);
      __ptr = state->stones[lVar1];
    }
    free(__ptr);
  }
  free(state->pending_action_queue);
  free(state->stones);
  free(state);
  return;
}

Assistant:

static void
free_dfg_state(EVdfg_configuration state)
{
    int i;
    for (i=0; i < state->stone_count; i++) {
    	if (state->stones[i]->out_links) free(state->stones[i]->out_links);
    	if (state->stones[i]->in_links) free(state->stones[i]->in_links);
    	if (state->stones[i]->action) free(state->stones[i]->action);
    	if (state->stones[i]->extra_actions) {
    	    int j;
    	    for (j=0; j < state->stones[i]->action_count-1; j++) {
    		free(state->stones[i]->extra_actions[j]);
    	    }
    	    free(state->stones[i]->extra_actions);
    	}
    	if (state->stones[i]->attrs) free_attr_list(state->stones[i]->attrs);
    	free(state->stones[i]);
    }
    if (state->pending_action_queue) free(state->pending_action_queue);
    free(state->stones);
    free(state);
}